

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

char * __thiscall cpptrace::nested_exception::message(nested_exception *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 auVar3 [12];
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  undefined8 local_20;
  exception_ptr local_18;
  nested_exception *local_10;
  nested_exception *this_local;
  
  local_10 = this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->message_value);
  if (bVar1) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,&this->ptr);
    auVar3 = std::rethrow_exception((exception_ptr)&local_18);
    local_24 = auVar3._8_4_;
    local_20 = auVar3._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    if (local_24 == 2) {
      local_70 = (long *)__cxa_begin_catch(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Nested exception: ",&local_b1);
      pcVar2 = (char *)(**(code **)(*local_70 + 0x10))();
      std::operator+(&local_90,&local_b0,pcVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->message_value,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      __cxa_end_catch();
    }
    else {
      __cxa_begin_catch(local_20);
      cpptrace::detail::exception_type_name_abi_cxx11_();
      std::operator+(&local_48,"Nested exception holding instance of ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->message_value,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&e);
      __cxa_end_catch();
    }
  }
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->message_value);
  return pcVar2;
}

Assistant:

const char* nested_exception::message() const noexcept {
        if(message_value.empty()) {
            try {
                std::rethrow_exception(ptr);
            } catch(std::exception& e) {
                message_value = std::string("Nested exception: ") + e.what();
            } catch(...) {
                message_value = "Nested exception holding instance of " + detail::exception_type_name();
            }
        }
        return message_value.c_str();
    }